

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test3DTileYsResource_Test::TestBody
          (CTestGen9Resource_Test3DTileYsResource_Test *this)

{
  uint uVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint32_t uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  uint32_t *puVar5;
  long lVar6;
  TEST_BPP TVar7;
  uint *puVar8;
  undefined4 local_b8;
  undefined1 auStack_b4 [12];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint *local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  auStack_b4 = SUB1612((undefined1  [16])0x0,4);
  local_b8 = 3;
  local_58._0_12_ = SUB1612((undefined1  [16])0x0,0);
  local_58[0xc] = 1;
  local_58._13_3_ = 0;
  local_a8 = ZEXT816(0x5000000000);
  auStack_b4._4_8_ = 0x400000000;
  TVar7 = TEST_BPP_8;
  puVar5 = &DAT_0018e270;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    auStack_b4._0_4_ = GVar2;
    local_88._8_8_ = 0x100000001;
    local_88._0_8_ = 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e230 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e250 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,*puVar5);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,1);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar5 = puVar5 + 3;
  }
  TVar7 = TEST_BPP_8;
  puVar8 = &DAT_0018e270;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    auStack_b4._0_4_ = GVar2;
    uVar1 = *puVar8;
    uVar3 = CTestResource::GetBppValue((CTestResource *)this,TVar7);
    local_88._4_4_ = 0;
    local_88._0_4_ = uVar1 / uVar3 + 1;
    local_88._8_8_ = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8,(ulong)uVar1 % (ulong)uVar3);
    local_38 = puVar8;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e230 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e250 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    puVar8 = local_38;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar8 = puVar8 + 3;
  }
  TVar7 = TEST_BPP_8;
  puVar8 = (uint *)&DAT_0018e274;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    auStack_b4._0_4_ = GVar2;
    uVar3 = CTestResource::GetBppValue((CTestResource *)this,TVar7);
    uVar1 = puVar8[-1];
    local_88._4_4_ = 0;
    local_88._0_4_ = uVar1 / uVar3 + 1;
    local_88._8_4_ = *puVar8 + 1;
    local_88._12_4_ = 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8,(ulong)uVar1 % (ulong)uVar3);
    local_38 = puVar8;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e230 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e250 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    puVar8 = local_38;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar8 = puVar8 + 3;
  }
  TVar7 = TEST_BPP_8;
  puVar8 = (uint *)&DAT_0018e274;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    auStack_b4._0_4_ = GVar2;
    uVar1 = puVar8[-1];
    uVar3 = CTestResource::GetBppValue((CTestResource *)this,TVar7);
    local_88._4_4_ = 0;
    local_88._0_4_ = uVar1 / uVar3 + 1;
    local_88._12_4_ = (int)((ulong)*(undefined8 *)puVar8 >> 0x20) + 1;
    local_88._8_4_ = (int)*(undefined8 *)puVar8 + 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8,(ulong)uVar1 % (ulong)uVar3);
    local_38 = puVar8;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e230 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e250 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,0x80000);
    puVar8 = local_38;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar8 = puVar8 + 3;
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileYsResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign[TEST_BPP_MAX] = {64, 32, 32, 32, 16};
    const uint32_t VAlign[TEST_BPP_MAX] = {32, 32, 32, 16, 16};

    const uint32_t TileSize[TEST_BPP_MAX][3] = {{64, 32, 32},
                                                {64, 32, 32},
                                                {128, 32, 16},
                                                {256, 16, 16},
                                                {256, 16, 16}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64));  // 1 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 2);  // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 4);  // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = TileSize[i][2] + 1;                      // 1 plane larger than 1 tile depth

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 8);   // 8 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}